

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionValue::parse_default
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details)

{
  element_type *this_00;
  string *psVar1;
  element_type *peVar2;
  shared_ptr<const_cxxopts::OptionDetails> *details_local;
  OptionValue *this_local;
  
  ensure_value(this,details);
  this->m_default = true;
  this_00 = std::
            __shared_ptr_access<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)details);
  psVar1 = OptionDetails::long_name_abi_cxx11_(this_00);
  this->m_long_name = psVar1;
  peVar2 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_value);
  (*peVar2->_vptr_Value[4])();
  return;
}

Assistant:

void
    parse_default(const std::shared_ptr<const OptionDetails>& details)
    {
      ensure_value(details);
      m_default = true;
      m_long_name = &details->long_name();
      m_value->parse();
    }